

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.h
# Opt level: O1

shared_ptr<slang::syntax::SyntaxTree> __thiscall
slang::syntax::SyntaxRewriter<TestRewriter>::transform
          (SyntaxRewriter<TestRewriter> *this,shared_ptr<slang::syntax::SyntaxTree> *tree,
          SourceLibrary *library)

{
  byte *pbVar1;
  SourceLibrary *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<slang::syntax::SyntaxTree> sVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  tree[1].super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
           ((library->name)._M_dataplus._M_p + 0x18);
  detail::ChangeCollection::clear((ChangeCollection *)(tree + 2));
  std::
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ::clear((vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
           *)(tree + 0x11));
  detail::visitSyntaxNode<slang::syntax::SyntaxNode,TestRewriter>
            (*(SyntaxNode **)((library->name)._M_dataplus._M_p + 8),(TestRewriter *)tree);
  if ((((tree[4].super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (tree[7].super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) &&
      (tree[10].super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) &&
     ((tree[0xd].super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 &&
      (tree[0x10].super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)))) {
    (this->alloc).head = (Segment *)(library->name)._M_dataplus._M_p;
    pbVar1 = (byte *)(library->name)._M_string_length;
    (this->alloc).endPtr = pbVar1;
    _Var2._M_pi = extraout_RDX;
    if (pbVar1 != (byte *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(undefined4 *)(pbVar1 + 8) = *(undefined4 *)(pbVar1 + 8) + 1;
        UNLOCK();
      }
      else {
        *(undefined4 *)(pbVar1 + 8) = *(undefined4 *)(pbVar1 + 8) + 1;
      }
    }
  }
  else {
    sVar3 = detail::transformTree
                      ((detail *)this,(BumpAllocator *)tree,
                       (shared_ptr<slang::syntax::SyntaxTree> *)library,
                       (ChangeCollection *)(tree + 2),
                       (vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
                        *)(tree + 0x11),in_RCX);
    _Var2 = sVar3.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  sVar3.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var2._M_pi;
  sVar3.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<slang::syntax::SyntaxTree>)
         sVar3.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SyntaxTree> transform(const std::shared_ptr<SyntaxTree>& tree,
                                          const SourceLibrary* library = nullptr) {
        sourceManager = &tree->sourceManager();
        commits.clear();
        tempTrees.clear();

        tree->root().visit(*DERIVED);

        if (commits.empty())
            return tree;

        return transformTree(std::move(alloc), tree, commits, tempTrees, library);
    }